

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

int Aig_TransferMappedClasses(Aig_Man_t *pAig,Aig_Man_t *pPart,int *pMapBack)

{
  int iVar1;
  void *pvVar2;
  Aig_Obj_t *pNode1;
  Aig_Obj_t *pNode2;
  int local_30;
  int local_2c;
  int k;
  int nClasses;
  Aig_Obj_t *pObj;
  int *pMapBack_local;
  Aig_Man_t *pPart_local;
  Aig_Man_t *pAig_local;
  
  local_2c = 0;
  if (pPart->pReprs != (Aig_Obj_t **)0x0) {
    for (local_30 = 0; iVar1 = Vec_PtrSize(pPart->vObjs), local_30 < iVar1; local_30 = local_30 + 1)
    {
      pvVar2 = Vec_PtrEntry(pPart->vObjs,local_30);
      if ((pvVar2 != (void *)0x0) &&
         (pPart->pReprs[*(int *)((long)pvVar2 + 0x24)] != (Aig_Obj_t *)0x0)) {
        local_2c = local_2c + 1;
        pNode1 = Aig_ManObj(pAig,pMapBack[*(int *)((long)pvVar2 + 0x24)]);
        pNode2 = Aig_ManObj(pAig,pMapBack[pPart->pReprs[*(int *)((long)pvVar2 + 0x24)]->Id]);
        Aig_ObjSetRepr_(pAig,pNode1,pNode2);
      }
    }
  }
  return local_2c;
}

Assistant:

int Aig_TransferMappedClasses( Aig_Man_t * pAig, Aig_Man_t * pPart, int * pMapBack )
{
    Aig_Obj_t * pObj;
    int nClasses, k;
    nClasses = 0;
    if ( pPart->pReprs ) {
      Aig_ManForEachObj( pPart, pObj, k )
      {
          if ( pPart->pReprs[pObj->Id] == NULL )
              continue;
          nClasses++;
          Aig_ObjSetRepr_( pAig,
              Aig_ManObj(pAig, pMapBack[pObj->Id]),
              Aig_ManObj(pAig, pMapBack[pPart->pReprs[pObj->Id]->Id]) );
      }
    }
    return nClasses;
}